

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall
ON_NurbsCage::SetCV(ON_NurbsCage *this,int i,int j,int k,point_style style,double *Point)

{
  double dVar1;
  bool bVar2;
  double *__dest;
  int local_64;
  double local_60;
  double *cv;
  double w;
  int n;
  bool rc;
  double *Point_local;
  point_style style_local;
  int k_local;
  int j_local;
  int i_local;
  ON_NurbsCage *this_local;
  
  this_local._7_1_ = true;
  __dest = CV(this,i,j,k);
  if (__dest == (double *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    switch(style) {
    case not_rational:
      memcpy(__dest,Point,(long)this->m_dim << 3);
      bVar2 = IsRational(this);
      if (bVar2) {
        __dest[this->m_dim] = 1.0;
      }
      break;
    case homogeneous_rational:
      bVar2 = IsRational(this);
      if (bVar2) {
        memcpy(__dest,Point,(long)(this->m_dim + 1) << 3);
      }
      else {
        if ((Point[this->m_dim] != 0.0) || (NAN(Point[this->m_dim]))) {
          local_60 = 1.0 / Point[this->m_dim];
        }
        else {
          local_60 = 1.0;
        }
        for (w._0_4_ = 0; w._0_4_ < this->m_dim; w._0_4_ = w._0_4_ + 1) {
          __dest[w._0_4_] = local_60 * Point[w._0_4_];
        }
      }
      break;
    case euclidean_rational:
      bVar2 = IsRational(this);
      if (bVar2) {
        dVar1 = Point[this->m_dim];
        for (w._0_4_ = 0; w._0_4_ < this->m_dim; w._0_4_ = w._0_4_ + 1) {
          __dest[i] = dVar1 * Point[i];
        }
        __dest[this->m_dim] = dVar1;
      }
      else {
        memcpy(__dest,Point,(long)this->m_dim << 3);
      }
      break;
    case intrinsic_point_style:
      if ((this->m_is_rat & 1U) == 0) {
        local_64 = this->m_dim;
      }
      else {
        local_64 = this->m_dim + 1;
      }
      memcpy(__dest,Point,(long)local_64 << 3);
      break;
    default:
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCage::SetCV( int i, int j, int k, ON::point_style style, const double* Point )
{
  bool rc = true;
  int n;
  double w;

  double* cv = CV(i,j,k);
  if ( !cv )
    return false;

  switch ( style ) {

  case ON::not_rational:  // input Point is not rational
    memcpy( cv, Point, m_dim*sizeof(*cv) );
    if ( IsRational() ) {
      // NURBS surface is rational - set weight to one
      cv[m_dim] = 1.0;
    }
    break;

  case ON::homogeneous_rational:  // input Point is homogeneous rational
    if ( IsRational() ) {
      // NURBS surface is rational
      memcpy( cv, Point, (m_dim+1)*sizeof(*cv) );
    }
    else {
      // NURBS surface is not rational
      w = (Point[m_dim] != 0.0) ? 1.0/Point[m_dim] : 1.0;
      for ( n = 0; n < m_dim; n++ ) {
        cv[n] = w*Point[n];
      }
    }
    break;

  case ON::euclidean_rational:  // input Point is euclidean rational
    if ( IsRational() ) {
      // NURBS surface is rational - convert euclean point to homogeneous form
      w = Point[m_dim];
      for ( n = 0; n < m_dim; n++ )
        cv[i] = w*Point[i];
      cv[m_dim] = w;
    }
    else {
      // NURBS surface is not rational
      memcpy( cv, Point, m_dim*sizeof(*cv) );
    }
    break;

  case ON::intrinsic_point_style:
    n = m_is_rat?m_dim+1:m_dim;
    memcpy(cv,Point,n*sizeof(*cv));
    break;
    
  default:
    rc = false;
    break;
  }
  return rc;
}